

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O3

bool __thiscall
Js::DynamicObjectPropertyEnumerator::Initialize
          (DynamicObjectPropertyEnumerator *this,DynamicObject *object,EnumeratorFlags flags,
          ScriptContext *requestContext,EnumeratorCache *enumeratorCache)

{
  Type *addr;
  Type TVar1;
  DynamicTypeHandler *pDVar2;
  long *plVar3;
  int *piVar4;
  code *pcVar5;
  type_info *ptVar6;
  undefined8 uVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  uint initialPropertyCount;
  BOOL BVar11;
  BigPropertyIndex initialPropertyCount_00;
  undefined4 *puVar12;
  ScriptContext *pSVar13;
  CachedData *pCVar14;
  Recycler *this_00;
  DynamicType *dynamicType;
  WriteBarrierPtr<Js::PropertyString> *pWVar15;
  undefined1 local_80 [8];
  TrackAllocData data;
  
  Memory::Recycler::WBSetBit((char *)this);
  (this->scriptContext).ptr = requestContext;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  addr = &this->object;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->object).ptr = object;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  this->flags = flags;
  if (object == (DynamicObject *)0x0) {
    (this->cachedData).ptr = (CachedData *)0x0;
    return true;
  }
  this->objectIndex = -1;
  this->enumeratedCount = 0;
  dynamicType = (DynamicType *)(object->super_RecyclableObject).type.ptr;
  if (((~flags & 0xc) != 0) ||
     (pSVar13 = (this->scriptContext).ptr, pSVar13->threadContext->TTDLog != (EventLog *)0x0)) {
    pDVar2 = (dynamicType->typeHandler).ptr;
    iVar10 = (*pDVar2->_vptr_DynamicTypeHandler[0x10])(pDVar2,object);
    if ((char)iVar10 == '\0') {
      return false;
    }
    dynamicType = (DynamicType *)(object->super_RecyclableObject).type.ptr;
    initialPropertyCount_00 = -1;
    if ((this->flags & SnapShotSemantics) != None) {
      initialPropertyCount_00 =
           (*(addr->ptr->super_RecyclableObject).super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])();
    }
    pCVar14 = (CachedData *)0x0;
LAB_00db08c3:
    Initialize(this,dynamicType,pCVar14,initialPropertyCount_00);
    return true;
  }
  if ((enumeratorCache != (EnumeratorCache *)0x0) &&
     (dynamicType == (DynamicType *)enumeratorCache->type)) {
    pCVar14 = (CachedData *)enumeratorCache->data;
    if (pCVar14 == (CachedData *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                  ,0x49,"(data != nullptr)","data != nullptr");
      if (!bVar8) goto LAB_00db08d9;
      *puVar12 = 0;
      pSVar13 = (this->scriptContext).ptr;
    }
    if ((pCVar14->scriptContext).ptr != pSVar13) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObjectPropertyEnumerator.cpp"
                                  ,0x4a,"(data->scriptContext == this->scriptContext)",
                                  "data->scriptContext == this->scriptContext");
      if (!bVar8) goto LAB_00db08d9;
      *puVar12 = 0;
    }
    if ((pCVar14->enumNonEnumerable == (Type)(this->flags & EnumNonEnumerable)) &&
       (pCVar14->enumSymbols == ((this->flags >> 1 & 1) != 0))) {
      initialPropertyCount_00 = pCVar14->propertyCount;
      goto LAB_00db08c3;
    }
  }
  pCVar14 = (CachedData *)
            ThreadContext::GetDynamicObjectEnumeratorCache
                      (requestContext->threadContext,dynamicType);
  if ((((pCVar14 != (CachedData *)0x0) &&
       ((pCVar14->scriptContext).ptr == (this->scriptContext).ptr)) &&
      (pCVar14->enumNonEnumerable == (Type)(this->flags & EnumNonEnumerable))) &&
     (pCVar14->enumSymbols == ((this->flags >> 1 & 1) != 0))) {
    Initialize(this,dynamicType,pCVar14,pCVar14->propertyCount);
    if (enumeratorCache != (EnumeratorCache *)0x0) {
      enumeratorCache->type = (Type *)dynamicType;
      enumeratorCache->data = pCVar14;
      return true;
    }
    return true;
  }
  plVar3 = *(long **)((object->super_RecyclableObject).type.ptr + 1);
  cVar9 = (**(code **)(*plVar3 + 0x80))(plVar3,object);
  if (cVar9 == '\0') {
    return false;
  }
  dynamicType = (DynamicType *)(object->super_RecyclableObject).type.ptr;
  bVar8 = DynamicType::PrepareForTypeSnapshotEnumeration(dynamicType);
  if (!bVar8) {
    initialPropertyCount_00 =
         (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
           _vptr_IRecyclerVisitedObject[10])(object);
    pCVar14 = (CachedData *)0x0;
    goto LAB_00db08c3;
  }
  initialPropertyCount = DynamicObject::GetPropertyCountForEnum(addr->ptr);
  data._32_8_ = ZEXT48(initialPropertyCount);
  ptVar6 = (type_info *)(data._32_8_ * 0xd);
  local_80 = (undefined1  [8])&CachedData::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ac78c4;
  data.filename._0_4_ = 0x70;
  data.typeinfo = ptVar6;
  this_00 = Memory::Recycler::TrackAllocInfo(requestContext->recycler,(TrackAllocData *)local_80);
  BVar11 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar11 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar8) goto LAB_00db08d9;
    *puVar12 = 0;
  }
  pCVar14 = (CachedData *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                      (this_00,(size_t)(ptVar6 + 0x30));
  if (pCVar14 == (CachedData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar8) {
LAB_00db08d9:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar12 = 0;
  }
  (pCVar14->indexes).ptr = (int *)0x0;
  (pCVar14->attributes).ptr = (uchar *)0x0;
  (pCVar14->scriptContext).ptr = (ScriptContext *)0x0;
  (pCVar14->strings).ptr = (WriteBarrierPtr<Js::PropertyString> *)0x0;
  Memory::Recycler::WBSetBit((char *)pCVar14);
  (pCVar14->scriptContext).ptr = requestContext;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pCVar14);
  pCVar14->cachedCount = 0;
  pCVar14->propertyCount = initialPropertyCount;
  Memory::Recycler::WBSetBit((char *)&pCVar14->strings);
  (pCVar14->strings).ptr = (WriteBarrierPtr<Js::PropertyString> *)(pCVar14 + 1);
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pCVar14->strings);
  uVar7 = data._32_8_;
  pWVar15 = (pCVar14->strings).ptr + data._32_8_;
  Memory::Recycler::WBSetBit((char *)&pCVar14->indexes);
  (pCVar14->indexes).ptr = (int *)pWVar15;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pCVar14->indexes);
  piVar4 = (pCVar14->indexes).ptr;
  Memory::Recycler::WBSetBit((char *)&pCVar14->attributes);
  (pCVar14->attributes).ptr = (uchar *)(piVar4 + uVar7);
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pCVar14->attributes);
  pCVar14->completed = false;
  TVar1 = this->flags;
  pCVar14->enumNonEnumerable = (Type)(TVar1 & EnumNonEnumerable);
  pCVar14->enumSymbols = (Type)(TVar1 >> 1 & 1);
  ThreadContext::AddDynamicObjectEnumeratorCache(requestContext->threadContext,dynamicType,pCVar14);
  Initialize(this,dynamicType,pCVar14,initialPropertyCount);
  if (enumeratorCache != (EnumeratorCache *)0x0) {
    enumeratorCache->type = (Type *)dynamicType;
    enumeratorCache->data = pCVar14;
    return true;
  }
  return true;
}

Assistant:

bool DynamicObjectPropertyEnumerator::Initialize(DynamicObject * object, EnumeratorFlags flags, ScriptContext * requestContext, EnumeratorCache * enumeratorCache)
    {
        this->scriptContext = requestContext;
        this->object = object;
        this->flags = flags;

        if (!object)
        {
            this->cachedData = nullptr;
            return true;
        }

        this->objectIndex = Constants::NoBigSlot;
        this->enumeratedCount = 0;

        if (!GetUseCache())
        {
            if (!object->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(object))
            {
                return false;
            }
            Initialize(object->GetDynamicType(), nullptr, GetSnapShotSemantics() ? this->object->GetPropertyCount() : Constants::NoBigSlot);
            return true;
        }

        DynamicType * type = object->GetDynamicType();

        CachedData * data;
        if (enumeratorCache && type == enumeratorCache->type)
        {
            data = (CachedData *)enumeratorCache->data;

            Assert(data != nullptr);
            Assert(data->scriptContext == this->scriptContext); // The cache data script context should be the same as request context

            if (data->enumNonEnumerable == GetEnumNonEnumerable() && data->enumSymbols == GetEnumSymbols())
            {
                Initialize(type, data, data->propertyCount);
                return true;
            }
        }

        data = (CachedData *)requestContext->GetThreadContext()->GetDynamicObjectEnumeratorCache(type);

        if (data != nullptr && data->scriptContext == this->scriptContext && data->enumNonEnumerable == GetEnumNonEnumerable() && data->enumSymbols == GetEnumSymbols())
        {
            Initialize(type, data, data->propertyCount);

            if (enumeratorCache)
            {
                enumeratorCache->type = type;
                enumeratorCache->data = data;
            }
            return true;
        }

        if (!object->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(object))
        {
            return false;
        }

        // Reload the type after EnsureObjectReady
        type = object->GetDynamicType();
        if (!type->PrepareForTypeSnapshotEnumeration())
        {
            Initialize(type, nullptr, object->GetPropertyCount());
            return true;
        }

        uint propertyCount = this->object->GetPropertyCountForEnum();
        data = RecyclerNewStructPlus(requestContext->GetRecycler(),
            propertyCount * sizeof(Field(PropertyString*)) + propertyCount * sizeof(BigPropertyIndex) + propertyCount * sizeof(PropertyAttributes), CachedData);
        data->scriptContext = requestContext;
        data->cachedCount = 0;
        data->propertyCount = propertyCount;
        data->strings = reinterpret_cast<Field(PropertyString*)*>(data + 1);
        data->indexes = unsafe_write_barrier_cast<BigPropertyIndex *>(data->strings + propertyCount);
        data->attributes = (PropertyAttributes*)(data->indexes + propertyCount);
        data->completed = false;
        data->enumNonEnumerable = GetEnumNonEnumerable();
        data->enumSymbols = GetEnumSymbols();
        requestContext->GetThreadContext()->AddDynamicObjectEnumeratorCache(type, data);
        Initialize(type, data, propertyCount);

        if (enumeratorCache)
        {
            enumeratorCache->type = type;
            enumeratorCache->data = data;
        }
        return true;
    }